

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::EnumDescriptorProto_EnumReservedRange::SharedCtor
          (EnumDescriptorProto_EnumReservedRange *this)

{
  long in_RDI;
  
  memset((void *)(in_RDI + 0x18),0,8);
  return;
}

Assistant:

void EnumDescriptorProto_EnumReservedRange::SharedCtor() {
  ::memset(&start_, 0, static_cast<size_t>(
      reinterpret_cast<char*>(&end_) -
      reinterpret_cast<char*>(&start_)) + sizeof(end_));
}